

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O0

void __thiscall
boost::unordered::detail::foa::
table_core<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,slang::DiagnosticSeverity>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::DiagCode,void>,std::equal_to<slang::DiagCode>,std::allocator<std::pair<slang::DiagCode_const,slang::DiagnosticSeverity>>>
::unchecked_insert<std::pair<slang::DiagCode_const,slang::DiagnosticSeverity>const&>
          (table_core<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,_slang::DiagnosticSeverity>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>
           *this,pair<const_slang::DiagCode,_slang::DiagnosticSeverity> *x)

{
  size_t pos0;
  table_core<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,_slang::DiagnosticSeverity>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>
  *in_RSI;
  DiagCode *in_RDI;
  size_t hash;
  table_core<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,_slang::DiagnosticSeverity>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>
  *in_stack_ffffffffffffffd0;
  pair<const_slang::DiagCode,_slang::DiagnosticSeverity> *in_stack_ffffffffffffffd8;
  size_t in_stack_ffffffffffffffe0;
  
  key_from<std::pair<slang::DiagCode_const,slang::DiagnosticSeverity>>
            ((pair<const_slang::DiagCode,_slang::DiagnosticSeverity> *)0x655ca1);
  pos0 = table_core<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,_slang::DiagnosticSeverity>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>
         ::hash_for<slang::DiagCode>(in_stack_ffffffffffffffd0,in_RDI);
  table_core<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,_slang::DiagnosticSeverity>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>
  ::position_for(in_stack_ffffffffffffffd0,(size_t)in_RDI);
  unchecked_emplace_at<std::pair<slang::DiagCode_const,slang::DiagnosticSeverity>const&>
            (in_RSI,pos0,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  return;
}

Assistant:

void unchecked_insert(Value&& x) {
        auto hash = hash_for(key_from(x));
        unchecked_emplace_at(position_for(hash), hash, std::forward<Value>(x));
    }